

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O2

ForContainer<std::set<int>,_std::string> * __thiscall
lest::to_string<std::set<int,std::less<int>,std::allocator<int>>>
          (ForContainer<std::set<int>,_std::string> *__return_storage_ptr__,lest *this,
          set<int,_std::less<int>,_std::allocator<int>_> *cont)

{
  ostream *poVar1;
  _Rb_tree_node_base *p_Var2;
  ostringstream os;
  string asStackY_1c8 [4];
  int in_stack_fffffffffffffe3c;
  ostringstream local_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::operator<<((ostream *)local_1a8,"{ ");
  for (p_Var2 = *(_Rb_tree_node_base **)(this + 0x18); p_Var2 != (_Rb_tree_node_base *)(this + 8);
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    to_string_abi_cxx11_(in_stack_fffffffffffffe3c);
    poVar1 = std::operator<<((ostream *)local_1a8,asStackY_1c8);
    std::operator<<(poVar1,", ");
    std::__cxx11::string::~string(asStackY_1c8);
  }
  std::operator<<((ostream *)local_1a8,"}");
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

auto to_string( C const & cont ) -> ForContainer<C, std::string>
{
    std::ostringstream os;
    os << "{ ";
    for ( auto & x : cont )
    {
        os << to_string( x ) << ", ";
    }
    os << "}";
    return os.str();
}